

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_vertical_14_quad_sse2
               (uchar *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_R8;
  uchar t_dst [256];
  uint8_t auStackY_a8 [4];
  int in_stack_ffffffffffffff5c;
  uchar *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  uchar *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  
  transpose_16x8(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  transpose_16x8(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  (*aom_lpf_horizontal_14_quad)(auStackY_a8,0x10,in_RDX,in_RCX,in_R8);
  transpose_16x8(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  transpose_16x8(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  return;
}

Assistant:

void aom_lpf_vertical_14_quad_sse2(unsigned char *s, int pitch,
                                   const uint8_t *_blimit0,
                                   const uint8_t *_limit0,
                                   const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[256]);

  // Transpose 16x16
  transpose_16x8(s - 8, s - 8 + 8 * pitch, pitch, t_dst, 16);
  transpose_16x8(s, s + 8 * pitch, pitch, t_dst + 8 * 16, 16);

  // Loop filtering
  aom_lpf_horizontal_14_quad(t_dst + 8 * 16, 16, _blimit0, _limit0, _thresh0);

  // Transpose back
  transpose_16x8(t_dst, t_dst + 8 * 16, 16, s - 8, pitch);
  transpose_16x8(t_dst + 8, t_dst + 8 + 8 * 16, 16, s - 8 + 8 * pitch, pitch);
}